

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void helpEnv(TidyDoc tdoc)

{
  char *pcVar1;
  char *pcVar2;
  ctmbstr ptVar3;
  tmbstr __ptr;
  
  pcVar1 = getenv("HTML_TIDY");
  pcVar2 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = tidyLocalizedString(0x35e);
  }
  ptVar3 = tidyLocalizedString(0x35d);
  __ptr = stringWithFormat(ptVar3,"/etc/tidy.conf","~/.tidyrc");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = tidyLocalizedString(0x35e);
  }
  putchar(10);
  ptVar3 = tidyLocalizedString(0x35c);
  printf(ptVar3,__ptr,pcVar2);
  if (pcVar1 != (char *)0x0) {
    ptVar3 = tidyLocalizedString(0x35f);
    printf(ptVar3,"~/.tidyrc");
  }
  free(__ptr);
  putchar(10);
  return;
}

Assistant:

static void helpEnv( TidyDoc tdoc )
{
    tmbstr subst = "";
    Bool uses_env = getenv("HTML_TIDY") != NULL;
    ctmbstr env_var = uses_env ? getenv("HTML_TIDY"): tidyLocalizedString( TC_TXT_HELP_ENV_1B );

#if defined( TIDY_CONFIG_FILE ) && defined( TIDY_USER_CONFIG_FILE )
    subst = stringWithFormat( tidyLocalizedString(TC_TXT_HELP_ENV_1A), TIDY_CONFIG_FILE, TIDY_USER_CONFIG_FILE );
#endif

    env_var = env_var != NULL ? env_var : tidyLocalizedString( TC_TXT_HELP_ENV_1B );

    printf( "\n" );
    printf( tidyLocalizedString( TC_TXT_HELP_ENV_1), subst, env_var );

#if defined( TIDY_CONFIG_FILE ) && defined( TIDY_USER_CONFIG_FILE )
    if ( uses_env )
        printf( tidyLocalizedString( TC_TXT_HELP_ENV_1C ), TIDY_USER_CONFIG_FILE );
    free( subst );
#endif

    printf( "\n" );
}